

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O1

UChar * u_strFromJavaModifiedUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  long lVar1;
  uint8_t uVar2;
  int32_t iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  UChar UVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  UChar *pUVar11;
  int iVar12;
  int32_t iVar13;
  uint8_t *puVar14;
  byte bVar15;
  int iVar16;
  UChar *pUVar17;
  int32_t local_6c;
  ulong local_68;
  UChar *local_60;
  UChar *local_58;
  int32_t local_4c;
  UChar *local_48;
  uint local_3c;
  int *local_38;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UChar *)0x0;
  }
  if (((srcLength < -1) || (src == (char *)0x0 && srcLength != 0)) ||
     (((0x10ffff < subchar || destCapacity < 0) || destCapacity != 0 && dest == (UChar *)0x0) ||
      (subchar & 0xfffff800U) == 0xd800)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = 0;
  }
  local_60 = dest + (uint)destCapacity;
  iVar12 = 0;
  pUVar11 = dest;
  local_58 = dest;
  local_4c = destCapacity;
  local_38 = pDestLength;
  if (srcLength < 0) {
    bVar15 = *src;
    if (destCapacity != 0 && '\0' < (char)bVar15) {
      do {
        *pUVar11 = (ushort)bVar15;
        pUVar11 = pUVar11 + 1;
        bVar15 = ((uint8_t *)src)[1];
        src = (char *)((uint8_t *)src + 1);
        if ((char)bVar15 < '\x01') break;
      } while (pUVar11 < local_60);
    }
    if (bVar15 == 0) {
      local_68 = (ulong)((long)pUVar11 - (long)dest) >> 1;
      if (pDestLength != (int32_t *)0x0) {
        *pDestLength = (int32_t)local_68;
      }
      u_terminateUChars_63(dest,destCapacity,(int32_t)local_68,pErrorCode);
      srcLength = -1;
    }
    else {
      sVar5 = strlen(src);
      srcLength = (int32_t)sVar5;
      local_68 = 0;
    }
    if (bVar15 == 0) {
      return local_58;
    }
  }
  else {
    local_68 = 0;
  }
  local_6c = 0;
  local_48 = local_58;
  do {
    iVar3 = local_6c;
    iVar4 = (int)((ulong)((long)local_60 - (long)pUVar11) >> 1);
    iVar8 = srcLength - local_6c;
    if (((0 < srcLength) && (iVar8 <= iVar4)) && (-1 < *src)) {
      iVar13 = local_6c;
      if (local_6c < srcLength) {
        puVar14 = (uint8_t *)src + local_6c;
        do {
          iVar13 = local_6c;
          if ((char)*puVar14 < '\0') break;
          *pUVar11 = (short)(char)*puVar14;
          pUVar11 = pUVar11 + 1;
          local_6c = local_6c + 1;
          puVar14 = puVar14 + 1;
          iVar13 = srcLength;
        } while (srcLength != local_6c);
      }
      iVar4 = iVar4 - (iVar13 - iVar3);
      iVar8 = iVar8 - (iVar13 - iVar3);
    }
    iVar10 = 4;
    if (subchar < 0x10000) {
      iVar16 = iVar8 / 3;
      if (iVar4 < iVar8 / 3) {
        iVar16 = iVar4;
      }
      if (2 < iVar16) {
        iVar16 = iVar16 + 1;
        do {
          lVar6 = (long)local_6c;
          lVar1 = lVar6 + 1;
          iVar4 = (int)lVar1;
          bVar15 = ((uint8_t *)src)[lVar6];
          if ((char)bVar15 < '\0') {
            if (bVar15 < 0xe0) {
              if ((bVar15 < 0xc0) || (0x3f < (byte)(((uint8_t *)src)[lVar1] ^ 0x80)))
              goto LAB_002f462a;
              *pUVar11 = (ushort)((bVar15 & 0x1f) << 6) | ((uint8_t *)src)[lVar1] ^ 0x80;
              local_6c = local_6c + 2;
            }
            else if (((bVar15 < 0xf0) && ((byte)(((uint8_t *)src)[lVar1] ^ 0x80) < 0x40)) &&
                    ((byte)(((uint8_t *)src)[lVar6 + 2] ^ 0x80) < 0x40)) {
              *pUVar11 = (ushort)bVar15 << 0xc | ((uint8_t *)src)[lVar6 + 2] ^ 0x80 |
                         (((uint8_t *)src)[lVar1] ^ 0x80) << 6;
              local_6c = local_6c + 3;
            }
            else {
LAB_002f462a:
              if (subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                iVar10 = 1;
                local_48 = (UChar *)0x0;
                local_6c = iVar4;
                goto LAB_002f467c;
              }
              local_6c = iVar4;
              utf8_nextCharSafeBody_63((uint8_t *)src,&local_6c,srcLength,(uint)bVar15,-1);
              iVar12 = iVar12 + 1;
              *pUVar11 = (UChar)subchar;
            }
          }
          else {
            *pUVar11 = (ushort)bVar15;
            local_6c = iVar4;
          }
          pUVar11 = pUVar11 + 1;
          iVar16 = iVar16 + -1;
        } while (1 < iVar16);
        iVar10 = 0;
      }
    }
LAB_002f467c:
  } while (iVar10 == 0);
  if (iVar10 != 4) {
    return local_48;
  }
  if ((srcLength <= local_6c) || (local_60 <= pUVar11)) {
LAB_002f481a:
    uVar9 = local_68;
    if (local_6c < srcLength) {
      do {
        uVar9 = uVar9 & 0xffffffff;
        while( true ) {
          lVar6 = (long)local_6c;
          lVar1 = lVar6 + 1;
          iVar8 = (int)lVar1;
          bVar15 = ((uint8_t *)src)[lVar6];
          iVar4 = (int)uVar9;
          if (-1 < (char)bVar15) break;
          if (0xdf < bVar15) {
            if (((bVar15 < 0xf0) && ((int)(lVar6 + 2) < srcLength)) &&
               ((char)((uint8_t *)src)[lVar1] < -0x40)) {
              iVar10 = 3;
              uVar2 = ((uint8_t *)src)[lVar6 + 2];
              goto joined_r0x002f486a;
            }
LAB_002f4895:
            if (subchar < 0) goto LAB_002f4913;
            local_6c = iVar8;
            utf8_nextCharSafeBody_63((uint8_t *)src,&local_6c,srcLength,(uint)bVar15,-1);
            iVar12 = iVar12 + 1;
            iVar8 = local_6c;
            break;
          }
          if ((bVar15 < 0xc0) || (srcLength <= iVar8)) goto LAB_002f4895;
          iVar10 = 2;
          uVar2 = ((uint8_t *)src)[lVar1];
joined_r0x002f486a:
          if (-0x41 < (char)uVar2) goto LAB_002f4895;
          local_6c = local_6c + iVar10;
          uVar9 = (ulong)(iVar4 + 1);
          if (srcLength <= local_6c) goto LAB_002f48c6;
        }
        local_6c = iVar8;
        uVar9 = (ulong)(iVar4 + 1);
      } while (local_6c < srcLength);
LAB_002f48c6:
      iVar4 = iVar4 + 1;
    }
    else {
      iVar4 = (int)local_68;
    }
    pUVar17 = local_58;
    if (pNumSubstitutions != (int32_t *)0x0) {
      *pNumSubstitutions = iVar12;
    }
    iVar4 = iVar4 + (int)((ulong)((long)pUVar11 - (long)local_58) >> 1);
    if (local_38 != (int *)0x0) {
      *local_38 = iVar4;
    }
    u_terminateUChars_63(local_58,local_4c,iVar4,pErrorCode);
    return pUVar17;
  }
  local_48 = (UChar *)CONCAT44(local_48._4_4_,((uint)subchar >> 10) - 0x2840);
  local_3c = subchar & 0x3ffU | 0xdc00;
LAB_002f46cb:
  pUVar17 = pUVar11;
  lVar6 = (long)local_6c;
  lVar1 = lVar6 + 1;
  iVar4 = (int)lVar1;
  bVar15 = ((uint8_t *)src)[lVar6];
  if ((char)bVar15 < '\0') {
    if (bVar15 < 0xe0) {
      if (((bVar15 < 0xc0) || (srcLength <= iVar4)) ||
         (0x3f < (byte)(((uint8_t *)src)[lVar1] ^ 0x80))) goto LAB_002f4782;
      UVar7 = (ushort)((bVar15 & 0x1f) << 6) | ((uint8_t *)src)[lVar1] ^ 0x80;
      iVar4 = 2;
LAB_002f475b:
      *pUVar17 = UVar7;
      local_6c = local_6c + iVar4;
      if ((srcLength <= local_6c) || (pUVar11 = pUVar17 + 1, local_60 <= pUVar17 + 1))
      goto LAB_002f4817;
      goto LAB_002f46cb;
    }
    if (((bVar15 < 0xf0) && ((int)(lVar6 + 2) < srcLength)) &&
       (((byte)(((uint8_t *)src)[lVar1] ^ 0x80) < 0x40 &&
        ((byte)(((uint8_t *)src)[lVar6 + 2] ^ 0x80) < 0x40)))) {
      UVar7 = (ushort)bVar15 << 0xc | ((uint8_t *)src)[lVar6 + 2] ^ 0x80 |
              (((uint8_t *)src)[lVar1] ^ 0x80) << 6;
      iVar4 = 3;
      goto LAB_002f475b;
    }
LAB_002f4782:
    if (subchar < 0) {
LAB_002f4913:
      *pErrorCode = U_INVALID_CHAR_FOUND;
      return (UChar *)0x0;
    }
    local_6c = iVar4;
    utf8_nextCharSafeBody_63((uint8_t *)src,&local_6c,srcLength,(uint)bVar15,-1);
    iVar12 = iVar12 + 1;
    pUVar11 = pUVar17 + 1;
    if (subchar < 0x10000) {
      *pUVar17 = (UChar)subchar;
      goto LAB_002f47df;
    }
    *pUVar17 = (UChar)local_48;
    if (local_60 <= pUVar11) {
      local_68 = (ulong)((int)local_68 + 1);
LAB_002f4817:
      pUVar11 = pUVar17 + 1;
      goto LAB_002f481a;
    }
    pUVar17[1] = (UChar)local_3c;
    pUVar11 = pUVar17 + 2;
  }
  else {
    *pUVar17 = (ushort)bVar15;
    pUVar11 = pUVar17 + 1;
    local_6c = iVar4;
  }
LAB_002f47df:
  if ((srcLength <= local_6c) || (local_60 <= pUVar11)) goto LAB_002f481a;
  goto LAB_002f46cb;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromJavaModifiedUTF8WithSub(
        UChar *dest,
        int32_t destCapacity,
        int32_t *pDestLength,
        const char *src,
        int32_t srcLength,
        UChar32 subchar, int32_t *pNumSubstitutions,
        UErrorCode *pErrorCode) {
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (dest==NULL && destCapacity!=0) || destCapacity<0 ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    if(srcLength < 0) {
        /*
         * Transform a NUL-terminated ASCII string.
         * Handle non-ASCII strings with slower code.
         */
        UChar32 c;
        while(((c = (uint8_t)*src) != 0) && c <= 0x7f && (pDest < pDestLimit)) {
            *pDest++=(UChar)c;
            ++src;
        }
        if(c == 0) {
            reqLength=(int32_t)(pDest - dest);
            if(pDestLength) {
                *pDestLength = reqLength;
            }

            /* Terminate the buffer */
            u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
            return dest;
        }
        srcLength = static_cast<int32_t>(uprv_strlen(src));
    }

    /* Faster loop without ongoing checking for srcLength and pDestLimit. */
    UChar32 ch;
    uint8_t t1, t2;
    int32_t i = 0;
    for(;;) {
        int32_t count = (int32_t)(pDestLimit - pDest);
        int32_t count2 = srcLength - i;
        if(count >= count2 && srcLength > 0 && U8_IS_SINGLE(*src)) {
            /* fast ASCII loop */
            int32_t start = i;
            uint8_t b;
            while(i < srcLength && U8_IS_SINGLE(b = src[i])) {
                *pDest++=b;
                ++i;
            }
            int32_t delta = i - start;
            count -= delta;
            count2 -= delta;
        }
        /*
         * Each iteration of the inner loop progresses by at most 3 UTF-8
         * bytes and one UChar.
         */
        if(subchar > 0xFFFF) {
            break;
        }
        count2 /= 3;
        if(count > count2) {
            count = count2; /* min(remaining dest, remaining src/3) */
        }
        if(count < 3) {
            /*
             * Too much overhead if we get near the end of the string,
             * continue with the next loop.
             */
            break;
        }
        do {
            ch = (uint8_t)src[i++];
            if(U8_IS_SINGLE(ch)) {
                *pDest++=(UChar)ch;
            } else {
                if(ch >= 0xe0) {
                    if( /* handle U+0000..U+FFFF inline */
                        ch <= 0xef &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                        (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                    ) {
                        /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                        *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                        i += 2;
                        continue;
                    }
                } else {
                    if( /* handle U+0000..U+07FF inline */
                        ch >= 0xc0 &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                    ) {
                        *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                        ++i;
                        continue;
                    }
                }

                if(subchar < 0) {
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                } else if(subchar > 0xffff && --count == 0) {
                    /*
                     * We need to write two UChars, adjusted count for that,
                     * and ran out of space.
                     */
                    --i;  // back out byte ch
                    break;
                } else {
                    /* function call for error cases */
                    utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                    ++numSubstitutions;
                    *(pDest++)=(UChar)subchar;
                }
            }
        } while(--count > 0);
    }

    while(i < srcLength && (pDest < pDestLimit)) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)){
            *pDest++=(UChar)ch;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                    (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                ) {
                    /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                    *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                ) {
                    *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                if(subchar<=0xFFFF) {
                    *(pDest++)=(UChar)subchar;
                } else {
                    *(pDest++)=U16_LEAD(subchar);
                    if(pDest<pDestLimit) {
                        *(pDest++)=U16_TRAIL(subchar);
                    } else {
                        reqLength++;
                        break;
                    }
                }
            }
        }
    }

    /* Pre-flight the rest of the string. */
    while(i < srcLength) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)) {
            reqLength++;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f &&
                    (uint8_t)(src[i+1] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                reqLength+=U16_LENGTH(ch);
            }
        }
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    reqLength+=(int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}